

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawList::AddPolyline
          (ImDrawList *this,ImVec2 *points,int points_count,ImU32 col,bool closed,float thickness)

{
  float *pfVar1;
  float *pfVar2;
  undefined8 uVar3;
  ImVec2 IVar4;
  ImVec2 IVar5;
  long lVar6;
  ulong uVar7;
  undefined8 *puVar8;
  ImVec2 *pIVar9;
  ImDrawIdx IVar10;
  ImDrawVert *pIVar11;
  ulong uVar12;
  ImDrawIdx IVar13;
  int iVar14;
  ulong uVar15;
  ImDrawIdx IVar16;
  int iVar17;
  ImDrawIdx *pIVar18;
  undefined7 in_register_00000081;
  ulong uVar19;
  ImDrawIdx IVar20;
  ulong uVar21;
  uint uVar22;
  ImDrawIdx IVar23;
  uint uVar24;
  bool bVar25;
  undefined4 in_XMM0_Db;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float afStack_78 [2];
  undefined8 uStack_70;
  ImVec2 local_68;
  undefined8 local_60;
  undefined8 local_58;
  float afStack_50 [3];
  int local_44;
  undefined4 local_40;
  uint local_3c;
  float *local_38;
  
  if (points_count < 2) {
    return;
  }
  IVar4 = this->_Data->TexUvWhitePixel;
  local_60 = (ulong)(points_count - 1U);
  local_38 = (float *)(ulong)(points_count - 1U);
  if (closed) {
    local_38 = (float *)(ulong)(uint)points_count;
  }
  local_58 = CONCAT44(in_XMM0_Db,thickness);
  iVar17 = (int)local_38;
  if ((this->Flags & 1) == 0) {
    uStack_70 = 0x132e31;
    PrimReserve(this,iVar17 * 6,iVar17 * 4);
    uVar12 = 1;
    do {
      uVar7 = uVar12 & 0xffffffff;
      if ((uint)points_count == uVar12) {
        uVar7 = 0;
      }
      fVar28 = points[uVar12 - 1].x;
      fVar32 = points[uVar12 - 1].y;
      fVar26 = points[uVar7].x - fVar28;
      fVar29 = points[uVar7].y - fVar32;
      fVar27 = fVar26 * fVar26 + fVar29 * fVar29;
      if (0.0 < fVar27) {
        fVar27 = 1.0 / SQRT(fVar27);
        fVar29 = fVar29 * fVar27;
        fVar26 = fVar26 * fVar27;
      }
      fVar29 = fVar29 * (float)local_58 * 0.5;
      fVar26 = fVar26 * (float)local_58 * 0.5;
      pIVar11 = this->_VtxWritePtr;
      IVar5.y = fVar32 - fVar26;
      IVar5.x = fVar28 + fVar29;
      pIVar11->pos = IVar5;
      pIVar11->uv = IVar4;
      pIVar11 = this->_VtxWritePtr;
      pIVar11->col = col;
      pIVar11[1].pos.x = points[uVar7].x + fVar29;
      pIVar11[1].pos.y = points[uVar7].y - fVar26;
      pIVar11[1].uv = IVar4;
      pIVar11 = this->_VtxWritePtr;
      pIVar11[1].col = col;
      pIVar11[2].pos.x = points[uVar7].x - fVar29;
      pIVar11[2].pos.y = points[uVar7].y + fVar26;
      pIVar11[2].uv = IVar4;
      pIVar11 = this->_VtxWritePtr;
      pIVar11[2].col = col;
      pIVar11[3].pos.x = points[uVar12 - 1].x - fVar29;
      pIVar11[3].pos.y = points[uVar12 - 1].y + fVar26;
      pIVar11[3].uv = IVar4;
      pIVar11 = this->_VtxWritePtr;
      pIVar11[3].col = col;
      this->_VtxWritePtr = pIVar11 + 4;
      uVar22 = this->_VtxCurrentIdx;
      pIVar18 = this->_IdxWritePtr;
      IVar16 = (ImDrawIdx)uVar22;
      *pIVar18 = IVar16;
      pIVar18[1] = IVar16 + 1;
      pIVar18[2] = IVar16 + 2;
      pIVar18[3] = IVar16;
      pIVar18[4] = IVar16 + 2;
      pIVar18[5] = IVar16 + 3;
      this->_IdxWritePtr = pIVar18 + 6;
      this->_VtxCurrentIdx = uVar22 + 4;
      bVar25 = uVar12 != ((ulong)local_38 & 0xffffffff);
      uVar12 = uVar12 + 1;
    } while (bVar25);
    return;
  }
  local_40 = (undefined4)CONCAT71(in_register_00000081,closed);
  local_3c = col & 0xffffff;
  local_68._1_7_ = 0;
  local_68.x._0_1_ = 1.0 < thickness;
  iVar14 = 0xc;
  if (1.0 < thickness) {
    iVar14 = 0x12;
  }
  local_44 = points_count * 3;
  if (1.0 < thickness) {
    local_44 = points_count * 4;
  }
  uStack_70 = 0x133006;
  PrimReserve(this,iVar14 * iVar17,local_44);
  lVar6 = -((ulong)(uint)(((int)local_68.x * 2 + 3) * points_count) * 8 + 0xf & 0xfffffffffffffff0);
  puVar8 = (undefined8 *)((long)&local_68 + lVar6);
  uVar7 = (ulong)(uint)points_count;
  pfVar1 = (float *)(puVar8 + uVar7);
  uVar15 = (ulong)local_38 & 0xffffffff;
  uVar12 = 1;
  do {
    uVar19 = uVar12 & 0xffffffff;
    if (uVar7 == uVar12) {
      uVar19 = 0;
    }
    fVar29 = points[uVar19].x - points[uVar12 - 1].x;
    fVar26 = points[uVar19].y - points[uVar12 - 1].y;
    fVar28 = fVar29 * fVar29 + fVar26 * fVar26;
    if (0.0 < fVar28) {
      fVar28 = 1.0 / SQRT(fVar28);
      fVar29 = fVar29 * fVar28;
      fVar26 = fVar26 * fVar28;
    }
    *(float *)((long)&uStack_70 + uVar12 * 8 + lVar6) = fVar26;
    *(float *)((long)&uStack_70 + uVar12 * 8 + lVar6 + 4) = -fVar29;
    bVar25 = uVar12 != uVar15;
    uVar12 = uVar12 + 1;
  } while (bVar25);
  local_38 = pfVar1;
  if ((char)local_40 == '\0') {
    *(undefined8 *)(pfVar1 + -2) = *(undefined8 *)(pfVar1 + -4);
    if ((float)local_58 <= 1.0) {
      fVar29 = (float)*puVar8;
      fVar26 = (float)((ulong)*puVar8 >> 0x20);
      fVar28 = (*points).x;
      fVar32 = (*points).y;
      *pfVar1 = fVar29 + fVar28;
      pfVar1[1] = fVar26 + fVar32;
      pfVar1[2] = fVar28 - fVar29;
      pfVar1[3] = fVar32 - fVar26;
      uVar12 = local_60 & 0xffffffff;
      fVar29 = points[uVar12].x;
      fVar26 = points[uVar12].y;
      uVar19 = (ulong)(uint)((int)local_60 * 2);
      *(ulong *)(pfVar1 + uVar19 * 2) =
           CONCAT44((float)((ulong)puVar8[uVar12] >> 0x20) + fVar26,(float)puVar8[uVar12] + fVar29);
      *(ulong *)(pfVar1 + uVar19 * 2 + 2) =
           CONCAT44(fVar26 - (float)((ulong)puVar8[uVar12] >> 0x20),fVar29 - (float)puVar8[uVar12]);
      goto LAB_001333e5;
    }
    fVar33 = ((float)local_58 + -1.0) * 0.5;
    fVar29 = fVar33 + 1.0;
    fVar26 = (float)*puVar8;
    fVar28 = (float)((ulong)*puVar8 >> 0x20);
    fVar32 = fVar26 * fVar29;
    fVar27 = fVar28 * fVar29;
    fVar30 = (*points).x;
    fVar31 = (*points).y;
    fVar26 = fVar26 * fVar33;
    fVar28 = fVar28 * fVar33;
    *pfVar1 = fVar32 + fVar30;
    pfVar1[1] = fVar27 + fVar31;
    pfVar1[2] = fVar26 + fVar30;
    pfVar1[3] = fVar28 + fVar31;
    pfVar1[4] = fVar30 - fVar26;
    pfVar1[5] = fVar31 - fVar28;
    pfVar1[6] = fVar30 - fVar32;
    pfVar1[7] = fVar31 - fVar27;
    uVar12 = local_60 & 0xffffffff;
    fVar26 = points[uVar12].x;
    fVar28 = points[uVar12].y;
    uVar19 = (ulong)(uint)((int)local_60 << 2);
    *(ulong *)(pfVar1 + uVar19 * 2) =
         CONCAT44((float)((ulong)puVar8[uVar12] >> 0x20) * fVar29 + fVar28,
                  (float)puVar8[uVar12] * fVar29 + fVar26);
    *(ulong *)(pfVar1 + uVar19 * 2 + 2) =
         CONCAT44((float)((ulong)puVar8[uVar12] >> 0x20) * fVar33 + fVar28,
                  (float)puVar8[uVar12] * fVar33 + fVar26);
    *(ulong *)(pfVar1 + uVar19 * 2 + 4) =
         CONCAT44(fVar28 - (float)((ulong)puVar8[uVar12] >> 0x20) * fVar33,
                  fVar26 - (float)puVar8[uVar12] * fVar33);
    *(ulong *)(pfVar1 + uVar19 * 2 + 6) =
         CONCAT44(fVar28 - (float)((ulong)puVar8[uVar12] >> 0x20) * fVar29,
                  fVar26 - (float)puVar8[uVar12] * fVar29);
  }
  else {
    if ((float)local_58 <= 1.0) {
LAB_001333e5:
      pIVar18 = this->_IdxWritePtr;
      uVar12 = 1;
      uVar22 = this->_VtxCurrentIdx;
      do {
        uVar19 = uVar12 & 0xffffffff;
        if (uVar7 == uVar12) {
          uVar19 = 0;
        }
        uVar24 = uVar22 + 3;
        if (uVar7 == uVar12) {
          uVar24 = this->_VtxCurrentIdx;
        }
        uVar3 = *(undefined8 *)((long)&uStack_70 + uVar12 * 8 + lVar6);
        fVar29 = ((float)puVar8[uVar19] + (float)uVar3) * 0.5;
        fVar26 = ((float)((ulong)puVar8[uVar19] >> 0x20) + (float)((ulong)uVar3 >> 0x20)) * 0.5;
        fVar28 = fVar29 * fVar29 + fVar26 * fVar26;
        if (1e-06 < fVar28) {
          fVar32 = 1.0 / SQRT(fVar28);
          fVar28 = 100.0;
          if (fVar32 <= 100.0) {
            fVar28 = fVar32;
          }
          fVar29 = fVar29 * fVar28;
          fVar26 = fVar26 * fVar28;
        }
        fVar28 = points[uVar19].x;
        fVar32 = points[uVar19].y;
        pfVar2 = pfVar1 + (ulong)(uint)((int)uVar19 * 2) * 2;
        *pfVar2 = fVar28 + fVar29;
        pfVar2[1] = fVar32 + fVar26;
        pfVar2[2] = fVar28 - fVar29;
        pfVar2[3] = fVar32 - fVar26;
        IVar23 = (ImDrawIdx)uVar24;
        *pIVar18 = IVar23;
        IVar16 = (ImDrawIdx)uVar22;
        pIVar18[1] = IVar16;
        pIVar18[2] = IVar16 + 2;
        pIVar18[3] = IVar16 + 2;
        pIVar18[4] = IVar23 + 2;
        pIVar18[5] = IVar23;
        pIVar18[6] = IVar23 + 1;
        pIVar18[7] = IVar16 + 1;
        pIVar18[8] = IVar16;
        pIVar18[9] = IVar16;
        pIVar18[10] = IVar23;
        pIVar18[0xb] = IVar23 + 1;
        pIVar18 = pIVar18 + 0xc;
        bVar25 = uVar12 != uVar15;
        uVar12 = uVar12 + 1;
        uVar22 = uVar24;
      } while (bVar25);
      this->_IdxWritePtr = pIVar18;
      pIVar11 = this->_VtxWritePtr;
      pIVar9 = (ImVec2 *)(puVar8 + uVar7 + 1);
      uVar12 = 0;
      do {
        pIVar11->pos = points[uVar12];
        this->_VtxWritePtr->uv = IVar4;
        pIVar11 = this->_VtxWritePtr;
        pIVar11->col = col;
        pIVar11[1].pos = pIVar9[-1];
        this->_VtxWritePtr[1].uv = IVar4;
        pIVar11 = this->_VtxWritePtr;
        pIVar11[1].col = local_3c;
        pIVar11[2].pos = *pIVar9;
        this->_VtxWritePtr[2].uv = IVar4;
        pIVar11 = this->_VtxWritePtr;
        pIVar11[2].col = local_3c;
        pIVar11 = pIVar11 + 3;
        this->_VtxWritePtr = pIVar11;
        uVar12 = uVar12 + 1;
        pIVar9 = pIVar9 + 2;
      } while (uVar7 != uVar12);
      goto LAB_00133563;
    }
    fVar33 = ((float)local_58 + -1.0) * 0.5;
  }
  pIVar18 = this->_IdxWritePtr;
  local_58 = -uVar15;
  uVar12 = 1;
  uVar22 = this->_VtxCurrentIdx;
  do {
    uVar19 = uVar12 & 0xffffffff;
    if (uVar7 == uVar12) {
      uVar19 = 0;
    }
    uVar24 = uVar22 + 4;
    if (uVar7 == uVar12) {
      uVar24 = this->_VtxCurrentIdx;
    }
    uVar3 = *(undefined8 *)((long)&uStack_70 + uVar12 * 8 + lVar6);
    fVar29 = ((float)puVar8[uVar19] + (float)uVar3) * 0.5;
    fVar26 = ((float)((ulong)puVar8[uVar19] >> 0x20) + (float)((ulong)uVar3 >> 0x20)) * 0.5;
    fVar28 = fVar29 * fVar29 + fVar26 * fVar26;
    if (1e-06 < fVar28) {
      fVar32 = 1.0 / SQRT(fVar28);
      fVar28 = 100.0;
      if (fVar32 <= 100.0) {
        fVar28 = fVar32;
      }
      fVar29 = fVar29 * fVar28;
      fVar26 = fVar26 * fVar28;
    }
    fVar28 = fVar29 * (fVar33 + 1.0);
    fVar32 = fVar26 * (fVar33 + 1.0);
    uVar21 = (ulong)(uint)((int)uVar19 * 4);
    fVar27 = points[uVar19].x;
    fVar30 = points[uVar19].y;
    pfVar1 = local_38 + uVar21 * 2;
    *pfVar1 = fVar27 + fVar28;
    pfVar1[1] = fVar30 + fVar32;
    pfVar1[2] = fVar27 + fVar29 * fVar33;
    pfVar1[3] = fVar30 + fVar26 * fVar33;
    pfVar1 = local_38 + uVar21 * 2 + 4;
    *pfVar1 = fVar27 - fVar29 * fVar33;
    pfVar1[1] = fVar30 - fVar26 * fVar33;
    pfVar1[2] = fVar27 - fVar28;
    pfVar1[3] = fVar30 - fVar32;
    IVar16 = (ImDrawIdx)uVar24;
    IVar20 = IVar16 + 1;
    *pIVar18 = IVar20;
    IVar23 = (ImDrawIdx)uVar22;
    pIVar18[1] = IVar23 + 1;
    IVar13 = IVar23 + 2;
    pIVar18[2] = IVar13;
    pIVar18[3] = IVar13;
    IVar10 = IVar16 + 2;
    pIVar18[4] = IVar10;
    pIVar18[5] = IVar20;
    pIVar18[6] = IVar20;
    pIVar18[7] = IVar23 + 1;
    pIVar18[8] = IVar23;
    pIVar18[9] = IVar23;
    pIVar18[10] = IVar16;
    pIVar18[0xb] = IVar20;
    pIVar18[0xc] = IVar10;
    pIVar18[0xd] = IVar13;
    pIVar18[0xe] = IVar23 + 3;
    pIVar18[0xf] = IVar23 + 3;
    pIVar18[0x10] = IVar16 + 3;
    pIVar18[0x11] = IVar10;
    pIVar18 = pIVar18 + 0x12;
    bVar25 = uVar12 != uVar15;
    uVar12 = uVar12 + 1;
    uVar22 = uVar24;
  } while (bVar25);
  this->_IdxWritePtr = pIVar18;
  pIVar11 = this->_VtxWritePtr;
  pIVar9 = (ImVec2 *)(puVar8 + uVar7 + 3);
  do {
    pIVar11->pos = pIVar9[-3];
    this->_VtxWritePtr->uv = IVar4;
    pIVar11 = this->_VtxWritePtr;
    pIVar11->col = local_3c;
    pIVar11[1].pos = pIVar9[-2];
    this->_VtxWritePtr[1].uv = IVar4;
    pIVar11 = this->_VtxWritePtr;
    pIVar11[1].col = col;
    pIVar11[2].pos = pIVar9[-1];
    this->_VtxWritePtr[2].uv = IVar4;
    pIVar11 = this->_VtxWritePtr;
    pIVar11[2].col = col;
    pIVar11[3].pos = *pIVar9;
    this->_VtxWritePtr[3].uv = IVar4;
    pIVar11 = this->_VtxWritePtr;
    pIVar11[3].col = local_3c;
    pIVar11 = pIVar11 + 4;
    this->_VtxWritePtr = pIVar11;
    pIVar9 = pIVar9 + 4;
    uVar7 = uVar7 - 1;
  } while (uVar7 != 0);
LAB_00133563:
  this->_VtxCurrentIdx = this->_VtxCurrentIdx + (uint)(ushort)local_44;
  return;
}

Assistant:

void ImDrawList::AddPolyline(const ImVec2* points, const int points_count, ImU32 col, bool closed, float thickness)
{
    if (points_count < 2)
        return;

    const ImVec2 uv = _Data->TexUvWhitePixel;

    int count = points_count;
    if (!closed)
        count = points_count-1;

    const bool thick_line = thickness > 1.0f;
    if (Flags & ImDrawListFlags_AntiAliasedLines)
    {
        // Anti-aliased stroke
        const float AA_SIZE = 1.0f;
        const ImU32 col_trans = col & ~IM_COL32_A_MASK;

        const int idx_count = thick_line ? count*18 : count*12;
        const int vtx_count = thick_line ? points_count*4 : points_count*3;
        PrimReserve(idx_count, vtx_count);

        // Temporary buffer
        ImVec2* temp_normals = (ImVec2*)alloca(points_count * (thick_line ? 5 : 3) * sizeof(ImVec2));
        ImVec2* temp_points = temp_normals + points_count;

        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1+1) == points_count ? 0 : i1+1;
            float dx = points[i2].x - points[i1].x;
            float dy = points[i2].y - points[i1].y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            temp_normals[i1].x = dy;
            temp_normals[i1].y = -dx;
        }
        if (!closed)
            temp_normals[points_count-1] = temp_normals[points_count-2];

        if (!thick_line)
        {
            if (!closed)
            {
                temp_points[0] = points[0] + temp_normals[0] * AA_SIZE;
                temp_points[1] = points[0] - temp_normals[0] * AA_SIZE;
                temp_points[(points_count-1)*2+0] = points[points_count-1] + temp_normals[points_count-1] * AA_SIZE;
                temp_points[(points_count-1)*2+1] = points[points_count-1] - temp_normals[points_count-1] * AA_SIZE;
            }

            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx;
            for (int i1 = 0; i1 < count; i1++)
            {
                const int i2 = (i1+1) == points_count ? 0 : i1+1;
                unsigned int idx2 = (i1+1) == points_count ? _VtxCurrentIdx : idx1+3;

                // Average normals
                float dm_x = (temp_normals[i1].x + temp_normals[i2].x) * 0.5f;
                float dm_y = (temp_normals[i1].y + temp_normals[i2].y) * 0.5f;
                IM_NORMALIZE2F_OVER_EPSILON_CLAMP(dm_x, dm_y, 0.000001f, 100.0f)
                dm_x *= AA_SIZE;
                dm_y *= AA_SIZE;

                // Add temporary vertexes
                ImVec2* out_vtx = &temp_points[i2*2];
                out_vtx[0].x = points[i2].x + dm_x;
                out_vtx[0].y = points[i2].y + dm_y;
                out_vtx[1].x = points[i2].x - dm_x;
                out_vtx[1].y = points[i2].y - dm_y;

                // Add indexes
                _IdxWritePtr[0] = (ImDrawIdx)(idx2+0); _IdxWritePtr[1] = (ImDrawIdx)(idx1+0); _IdxWritePtr[2] = (ImDrawIdx)(idx1+2);
                _IdxWritePtr[3] = (ImDrawIdx)(idx1+2); _IdxWritePtr[4] = (ImDrawIdx)(idx2+2); _IdxWritePtr[5] = (ImDrawIdx)(idx2+0);
                _IdxWritePtr[6] = (ImDrawIdx)(idx2+1); _IdxWritePtr[7] = (ImDrawIdx)(idx1+1); _IdxWritePtr[8] = (ImDrawIdx)(idx1+0);
                _IdxWritePtr[9] = (ImDrawIdx)(idx1+0); _IdxWritePtr[10]= (ImDrawIdx)(idx2+0); _IdxWritePtr[11]= (ImDrawIdx)(idx2+1);
                _IdxWritePtr += 12;

                idx1 = idx2;
            }

            // Add vertexes
            for (int i = 0; i < points_count; i++)
            {
                _VtxWritePtr[0].pos = points[i];          _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;
                _VtxWritePtr[1].pos = temp_points[i*2+0]; _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col_trans;
                _VtxWritePtr[2].pos = temp_points[i*2+1]; _VtxWritePtr[2].uv = uv; _VtxWritePtr[2].col = col_trans;
                _VtxWritePtr += 3;
            }
        }
        else
        {
            const float half_inner_thickness = (thickness - AA_SIZE) * 0.5f;
            if (!closed)
            {
                temp_points[0] = points[0] + temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[1] = points[0] + temp_normals[0] * (half_inner_thickness);
                temp_points[2] = points[0] - temp_normals[0] * (half_inner_thickness);
                temp_points[3] = points[0] - temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[(points_count-1)*4+0] = points[points_count-1] + temp_normals[points_count-1] * (half_inner_thickness + AA_SIZE);
                temp_points[(points_count-1)*4+1] = points[points_count-1] + temp_normals[points_count-1] * (half_inner_thickness);
                temp_points[(points_count-1)*4+2] = points[points_count-1] - temp_normals[points_count-1] * (half_inner_thickness);
                temp_points[(points_count-1)*4+3] = points[points_count-1] - temp_normals[points_count-1] * (half_inner_thickness + AA_SIZE);
            }

            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx;
            for (int i1 = 0; i1 < count; i1++)
            {
                const int i2 = (i1+1) == points_count ? 0 : i1+1;
                unsigned int idx2 = (i1+1) == points_count ? _VtxCurrentIdx : idx1+4;

                // Average normals
                float dm_x = (temp_normals[i1].x + temp_normals[i2].x) * 0.5f;
                float dm_y = (temp_normals[i1].y + temp_normals[i2].y) * 0.5f;
                IM_NORMALIZE2F_OVER_EPSILON_CLAMP(dm_x, dm_y, 0.000001f, 100.0f);
                float dm_out_x = dm_x * (half_inner_thickness + AA_SIZE);
                float dm_out_y = dm_y * (half_inner_thickness + AA_SIZE);
                float dm_in_x = dm_x * half_inner_thickness;
                float dm_in_y = dm_y * half_inner_thickness;

                // Add temporary vertexes
                ImVec2* out_vtx = &temp_points[i2*4];
                out_vtx[0].x = points[i2].x + dm_out_x;
                out_vtx[0].y = points[i2].y + dm_out_y;
                out_vtx[1].x = points[i2].x + dm_in_x;
                out_vtx[1].y = points[i2].y + dm_in_y;
                out_vtx[2].x = points[i2].x - dm_in_x;
                out_vtx[2].y = points[i2].y - dm_in_y;
                out_vtx[3].x = points[i2].x - dm_out_x;
                out_vtx[3].y = points[i2].y - dm_out_y;

                // Add indexes
                _IdxWritePtr[0]  = (ImDrawIdx)(idx2+1); _IdxWritePtr[1]  = (ImDrawIdx)(idx1+1); _IdxWritePtr[2]  = (ImDrawIdx)(idx1+2);
                _IdxWritePtr[3]  = (ImDrawIdx)(idx1+2); _IdxWritePtr[4]  = (ImDrawIdx)(idx2+2); _IdxWritePtr[5]  = (ImDrawIdx)(idx2+1);
                _IdxWritePtr[6]  = (ImDrawIdx)(idx2+1); _IdxWritePtr[7]  = (ImDrawIdx)(idx1+1); _IdxWritePtr[8]  = (ImDrawIdx)(idx1+0);
                _IdxWritePtr[9]  = (ImDrawIdx)(idx1+0); _IdxWritePtr[10] = (ImDrawIdx)(idx2+0); _IdxWritePtr[11] = (ImDrawIdx)(idx2+1);
                _IdxWritePtr[12] = (ImDrawIdx)(idx2+2); _IdxWritePtr[13] = (ImDrawIdx)(idx1+2); _IdxWritePtr[14] = (ImDrawIdx)(idx1+3);
                _IdxWritePtr[15] = (ImDrawIdx)(idx1+3); _IdxWritePtr[16] = (ImDrawIdx)(idx2+3); _IdxWritePtr[17] = (ImDrawIdx)(idx2+2);
                _IdxWritePtr += 18;

                idx1 = idx2;
            }

            // Add vertexes
            for (int i = 0; i < points_count; i++)
            {
                _VtxWritePtr[0].pos = temp_points[i*4+0]; _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col_trans;
                _VtxWritePtr[1].pos = temp_points[i*4+1]; _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col;
                _VtxWritePtr[2].pos = temp_points[i*4+2]; _VtxWritePtr[2].uv = uv; _VtxWritePtr[2].col = col;
                _VtxWritePtr[3].pos = temp_points[i*4+3]; _VtxWritePtr[3].uv = uv; _VtxWritePtr[3].col = col_trans;
                _VtxWritePtr += 4;
            }
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
    else
    {
        // Non Anti-aliased Stroke
        const int idx_count = count*6;
        const int vtx_count = count*4;      // FIXME-OPT: Not sharing edges
        PrimReserve(idx_count, vtx_count);

        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1+1) == points_count ? 0 : i1+1;
            const ImVec2& p1 = points[i1];
            const ImVec2& p2 = points[i2];

            float dx = p2.x - p1.x;
            float dy = p2.y - p1.y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            dx *= (thickness * 0.5f);
            dy *= (thickness * 0.5f);

            _VtxWritePtr[0].pos.x = p1.x + dy; _VtxWritePtr[0].pos.y = p1.y - dx; _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr[1].pos.x = p2.x + dy; _VtxWritePtr[1].pos.y = p2.y - dx; _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col;
            _VtxWritePtr[2].pos.x = p2.x - dy; _VtxWritePtr[2].pos.y = p2.y + dx; _VtxWritePtr[2].uv = uv; _VtxWritePtr[2].col = col;
            _VtxWritePtr[3].pos.x = p1.x - dy; _VtxWritePtr[3].pos.y = p1.y + dx; _VtxWritePtr[3].uv = uv; _VtxWritePtr[3].col = col;
            _VtxWritePtr += 4;

            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx+1); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx+2);
            _IdxWritePtr[3] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[4] = (ImDrawIdx)(_VtxCurrentIdx+2); _IdxWritePtr[5] = (ImDrawIdx)(_VtxCurrentIdx+3);
            _IdxWritePtr += 6;
            _VtxCurrentIdx += 4;
        }
    }
}